

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O1

uint64_t __thiscall helix::order_book::ask_price(order_book *this,size_t level)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  p_Var1 = (this->_asks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->_asks)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (_Base_ptr)0xffffffffffffffff;
  bVar4 = (_Rb_tree_header *)p_Var1 == p_Var3;
  if (!bVar4) {
    if (level != 0) {
      do {
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
        bVar4 = (_Rb_tree_header *)p_Var1 == p_Var3;
        if (bVar4) {
          return 0xffffffffffffffff;
        }
        level = level - 1;
      } while (level != 0);
    }
    if (!bVar4) {
      p_Var2 = p_Var1[1]._M_parent;
    }
  }
  return (uint64_t)p_Var2;
}

Assistant:

uint64_t order_book::ask_price(size_t level) const
{
    auto it = _asks.begin();
    while (it != _asks.end() && level--) {
        it++;
    }
    if (it != _asks.end()) {
        auto&& level = it->second;
        return level.price;
    }
    return std::numeric_limits<uint64_t>::max();
}